

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

ssize_t __thiscall
just::process::impl::input_file::read_abi_cxx11_
          (input_file *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  ostringstream s;
  char buff [1024];
  ostringstream local_5a0 [376];
  undefined1 local_428 [1032];
  
  std::__cxx11::ostringstream::ostringstream(local_5a0);
  while (((input_file *)CONCAT44(in_register_00000034,__fd))->_eof == false) {
    read((input_file *)CONCAT44(in_register_00000034,__fd),(int)local_428,(void *)0x400,__nbytes);
    std::ostream::write((char *)local_5a0,(long)local_428);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_5a0);
  return (ssize_t)this;
}

Assistant:

std::string read()
        {
          std::ostringstream s;
          static const int buffsize = 1024;
          char buff[buffsize];
          while (!eof())
          {
            s.write(buff, read(buff, buffsize));
          }
          return s.str();
        }